

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

int Abc_NtkRecTruthCompare(int *p1,int *p2)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  Vec_Mem_t *pVVar6;
  int iVar7;
  
  uVar2 = *p1;
  if (-1 < (long)(int)uVar2) {
    uVar3 = s_pMan3->vSupps->nSize;
    if ((int)uVar2 < (int)uVar3) {
      uVar4 = *p2;
      if ((-1 < (long)(int)uVar4) && (uVar4 < uVar3)) {
        pcVar5 = s_pMan3->vSupps->pArray;
        iVar7 = (int)pcVar5[(int)uVar2] - (int)pcVar5[(int)uVar4];
        if (iVar7 != 0) {
          return iVar7;
        }
        pVVar6 = s_pMan3->vTtMem;
        if (((int)uVar2 < pVVar6->nEntries) && (uVar4 < (uint)pVVar6->nEntries)) {
          bVar1 = (byte)pVVar6->LogPageSze;
          iVar7 = memcmp(pVVar6->ppPages[uVar2 >> (bVar1 & 0x1f)] +
                         (int)((uVar2 & pVVar6->PageMask) * pVVar6->nEntrySize),
                         pVVar6->ppPages[uVar4 >> (bVar1 & 0x1f)] +
                         (int)((pVVar6->PageMask & uVar4) * pVVar6->nEntrySize),
                         (long)s_pMan3->nWords << 3);
          return iVar7;
        }
        __assert_fail("i >= 0 && i < p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

int Abc_NtkRecTruthCompare( int * p1, int * p2 ) 
{
    int Diff = Vec_StrEntry( s_pMan3->vSupps, *p1 ) - Vec_StrEntry( s_pMan3->vSupps, *p2 );
    if ( Diff )
        return Diff;
    return memcmp( Vec_MemReadEntry(s_pMan3->vTtMem, *p1), Vec_MemReadEntry(s_pMan3->vTtMem, *p2), sizeof(word) * s_pMan3->nWords ); 
}